

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O1

VM * newVM(void)

{
  VM *vm;
  ObjMap *pOVar1;
  
  vm = (VM *)malloc(0x90);
  if (vm == (VM *)0x0) {
    errorReport((void *)0x0,ERROR_MEM,"allocate VM failed!");
  }
  vm->allocatedBytes = 0;
  vm->allObjects = (ObjHeader *)0x0;
  vm->curParser = (Parser *)0x0;
  StringBufferInit(&vm->allMethodNames);
  pOVar1 = newObjMap(vm);
  vm->allModules = pOVar1;
  vm->curParser = (Parser *)0x0;
  buildCore(vm);
  return vm;
}

Assistant:

VM *newVM() {
    VM *vm = (VM *) malloc(sizeof(VM));
    if (vm == NULL) {
        MEM_ERROR("allocate VM failed!");
    }
    initVM(vm);
    buildCore(vm);
    return vm;
}